

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_pulse.c
# Opt level: O0

int create_pa_stream(cubeb_stream_conflict *stm,pa_stream **pa_stm,
                    cubeb_stream_params *stream_params,char *stream_name)

{
  pa_channel_map *ppVar1;
  pa_stream *ppVar2;
  char *in_RCX;
  cubeb_sample_format *in_RDX;
  long *in_RSI;
  long *in_RDI;
  pa_channel_map cm_1;
  pa_channel_map cm;
  pa_sample_spec ss;
  pa_channel_map *in_stack_fffffffffffffec8;
  pa_channel_position_t in_stack_fffffffffffffed4;
  pa_channel_map local_b8;
  pa_sample_spec local_34;
  char *local_28;
  cubeb_sample_format *local_20;
  long *local_18;
  long *local_10;
  int local_4;
  
  if ((in_RDX[4] & CUBEB_SAMPLE_S16BE) == CUBEB_SAMPLE_S16LE) {
    *in_RSI = 0;
    local_28 = in_RCX;
    local_20 = in_RDX;
    local_18 = in_RSI;
    local_10 = in_RDI;
    local_34.format = to_pulse_format(*in_RDX);
    if (local_34.format == PA_SAMPLE_INVALID) {
      local_4 = -2;
    }
    else {
      local_34.rate = local_20[1];
      if (local_20[2] < 0x100) {
        local_34.channels = (uint8_t)local_20[2];
        if (local_20[3] == CUBEB_SAMPLE_S16LE) {
          if ((local_20[2] < 9) &&
             (ppVar1 = (*cubeb_pa_channel_map_init_auto)(&local_b8,local_20[2],PA_CHANNEL_MAP_AIFF),
             ppVar1 == (pa_channel_map *)0x0)) {
            if ((g_cubeb_log_callback != (cubeb_log_callback)0x0) &&
               (g_cubeb_log_level != CUBEB_LOG_DISABLED)) {
              (*g_cubeb_log_callback)
                        ("%s:%d: Layout undefined and PulseAudio\'s default layout has not been configured, guess one.\n"
                         ,"cubeb_pulse.c",0x355);
            }
            pulse_default_layout_for_channels(local_20[2]);
            layout_to_channel_map(in_stack_fffffffffffffed4,in_stack_fffffffffffffec8);
            ppVar2 = (*cubeb_pa_stream_new)
                               (*(pa_context **)(*local_10 + 0x18),local_28,&local_34,&local_b8);
            *local_18 = (long)ppVar2;
          }
          else {
            if ((g_cubeb_log_callback != (cubeb_log_callback)0x0) &&
               (g_cubeb_log_level != CUBEB_LOG_DISABLED)) {
              (*g_cubeb_log_callback)
                        ("%s:%d: Layout undefined, PulseAudio will use its default.\n",
                         "cubeb_pulse.c",0x359);
            }
            ppVar2 = (*cubeb_pa_stream_new)
                               (*(pa_context **)(*local_10 + 0x18),local_28,&local_34,
                                (pa_channel_map *)0x0);
            *local_18 = (long)ppVar2;
          }
        }
        else {
          layout_to_channel_map(in_stack_fffffffffffffed4,in_stack_fffffffffffffec8);
          ppVar2 = (*cubeb_pa_stream_new)
                             (*(pa_context **)(*local_10 + 0x18),local_28,&local_34,
                              (pa_channel_map *)&stack0xfffffffffffffec4);
          *local_18 = (long)ppVar2;
        }
        local_4 = 0;
        if (*local_18 == 0) {
          local_4 = -1;
        }
      }
      else {
        local_4 = -2;
      }
    }
  }
  else {
    local_4 = -4;
  }
  return local_4;
}

Assistant:

static int
create_pa_stream(cubeb_stream * stm,
                 pa_stream ** pa_stm,
                 cubeb_stream_params * stream_params,
                 char const * stream_name)
{
  assert(stm && stream_params);
  assert(&stm->input_stream == pa_stm || (&stm->output_stream == pa_stm &&
         (stream_params->layout == CUBEB_LAYOUT_UNDEFINED ||
         (stream_params->layout != CUBEB_LAYOUT_UNDEFINED &&
         cubeb_channel_layout_nb_channels(stream_params->layout) == stream_params->channels))));
  if (stream_params->prefs & CUBEB_STREAM_PREF_LOOPBACK) {
    return CUBEB_ERROR_NOT_SUPPORTED;
  }
  *pa_stm = NULL;
  pa_sample_spec ss;
  ss.format = to_pulse_format(stream_params->format);
  if (ss.format == PA_SAMPLE_INVALID)
    return CUBEB_ERROR_INVALID_FORMAT;
  ss.rate = stream_params->rate;
  if (stream_params->channels > UINT8_MAX)
    return CUBEB_ERROR_INVALID_FORMAT;
  ss.channels = (uint8_t) stream_params->channels;

  if (stream_params->layout == CUBEB_LAYOUT_UNDEFINED) {
    pa_channel_map cm;
    if (stream_params->channels <= 8 &&
       !WRAP(pa_channel_map_init_auto)(&cm, stream_params->channels, PA_CHANNEL_MAP_DEFAULT)) {
      LOG("Layout undefined and PulseAudio's default layout has not been configured, guess one.");
      layout_to_channel_map(pulse_default_layout_for_channels(stream_params->channels), &cm);
      *pa_stm = WRAP(pa_stream_new)(stm->context->context, stream_name, &ss, &cm);
    } else {
      LOG("Layout undefined, PulseAudio will use its default.");
      *pa_stm = WRAP(pa_stream_new)(stm->context->context, stream_name, &ss, NULL);
    }
  } else {
    pa_channel_map cm;
    layout_to_channel_map(stream_params->layout, &cm);
    *pa_stm = WRAP(pa_stream_new)(stm->context->context, stream_name, &ss, &cm);
  }
  return (*pa_stm == NULL) ? CUBEB_ERROR : CUBEB_OK;
}